

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O0

void frssort(string *strings,size_t scnt)

{
  list_conflict t;
  ulong local_30;
  size_t i;
  list_conflict listnodes;
  list_conflict ptr;
  size_t scnt_local;
  string *strings_local;
  
  t = (list_conflict)calloc(scnt,0x18);
  for (local_30 = 0; local_30 < scnt; local_30 = local_30 + 1) {
    t[local_30].str = strings[local_30];
    if (local_30 < scnt - 1) {
      t[local_30].next = t + local_30 + 1;
    }
    else {
      t[local_30].next = (list)0x0;
    }
  }
  i = (size_t)forward2(t,(int)scnt);
  for (local_30 = 0; local_30 < scnt; local_30 = local_30 + 1) {
    strings[local_30] = *(string *)i;
    i = *(size_t *)(i + 8);
  }
  free(t);
  return;
}

Assistant:

void frssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = forward2(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}